

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O2

cx_string<58UL> * __thiscall
mserialize::cx_strcat<9ul,2ul,24ul,2ul,12ul,3ul,1ul,3ul,1ul,1ul>
          (cx_string<58UL> *__return_storage_ptr__,mserialize *this,cx_string<9UL> *strings,
          cx_string<2UL> *strings_1,cx_string<24UL> *strings_2,cx_string<2UL> *strings_3,
          cx_string<12UL> *strings_4,cx_string<3UL> *strings_5,cx_string<1UL> *strings_6,
          cx_string<3UL> *strings_7,cx_string<1UL> *strings_8,cx_string<1UL> *strings_9)

{
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  ulong auStack_108 [12];
  long lStack_a8;
  mserialize *local_a0;
  cx_string<9UL> *local_98;
  cx_string<2UL> *local_90;
  cx_string<24UL> *local_88;
  cx_string<2UL> *local_80;
  cx_string<12UL> *local_78;
  cx_string<3UL> *pcStack_70;
  cx_string<1UL> *local_68;
  cx_string<3UL> *pcStack_60;
  cx_string<1UL> *local_58;
  char buffer [59];
  
  pcVar1 = buffer;
  buffer[0x30] = '\0';
  buffer[0x31] = '\0';
  buffer[0x32] = '\0';
  buffer[0x33] = '\0';
  buffer[0x34] = '\0';
  buffer[0x35] = '\0';
  buffer[0x36] = '\0';
  buffer[0x37] = '\0';
  buffer[0x38] = '\0';
  buffer[0x39] = '\0';
  buffer[0x3a] = '\0';
  buffer[0x20] = '\0';
  buffer[0x21] = '\0';
  buffer[0x22] = '\0';
  buffer[0x23] = '\0';
  buffer[0x24] = '\0';
  buffer[0x25] = '\0';
  buffer[0x26] = '\0';
  buffer[0x27] = '\0';
  buffer[0x28] = '\0';
  buffer[0x29] = '\0';
  buffer[0x2a] = '\0';
  buffer[0x2b] = '\0';
  buffer[0x2c] = '\0';
  buffer[0x2d] = '\0';
  buffer[0x2e] = '\0';
  buffer[0x2f] = '\0';
  buffer[0x10] = '\0';
  buffer[0x11] = '\0';
  buffer[0x12] = '\0';
  buffer[0x13] = '\0';
  buffer[0x14] = '\0';
  buffer[0x15] = '\0';
  buffer[0x16] = '\0';
  buffer[0x17] = '\0';
  buffer[0x18] = '\0';
  buffer[0x19] = '\0';
  buffer[0x1a] = '\0';
  buffer[0x1b] = '\0';
  buffer[0x1c] = '\0';
  buffer[0x1d] = '\0';
  buffer[0x1e] = '\0';
  buffer[0x1f] = '\0';
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  buffer[8] = '\0';
  buffer[9] = '\0';
  buffer[10] = '\0';
  buffer[0xb] = '\0';
  buffer[0xc] = '\0';
  buffer[0xd] = '\0';
  buffer[0xe] = '\0';
  buffer[0xf] = '\0';
  local_a0 = this;
  local_98 = strings;
  local_90 = strings_1;
  local_88 = strings_2;
  local_80 = strings_3;
  local_78 = strings_4;
  pcStack_70 = strings_5;
  local_68 = strings_6;
  pcStack_60 = strings_7;
  local_58 = strings_8;
  auStack_108[1] = 9;
  auStack_108[2] = 2;
  auStack_108[3] = 0x18;
  auStack_108[4] = 2;
  auStack_108[5] = 0xc;
  auStack_108[6] = 3;
  auStack_108[7] = 1;
  auStack_108[8] = 3;
  auStack_108[9] = 1;
  auStack_108[10] = 1;
  for (lVar2 = 1; lVar2 != 0xb; lVar2 = lVar2 + 1) {
    for (uVar3 = 0; uVar3 < auStack_108[lVar2]; uVar3 = uVar3 + 1) {
      pcVar1[uVar3] = *(char *)((&lStack_a8)[lVar2] + uVar3);
    }
    pcVar1 = pcVar1 + uVar3;
  }
  cx_string<58UL>::cx_string(__return_storage_ptr__,buffer);
  return __return_storage_ptr__;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}